

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O2

void __thiscall
glcts::SampleShadingRenderCase::SampleShadingRenderCase
          (SampleShadingRenderCase *this,Context *context,char *name,char *description,
          GLSLVersion glslVersion,GLenum internalFormat,TextureFormat *texFormat,char *sampler,
          char *outType,GLfloat min,GLfloat max,char *extension,GLfloat sampleShading)

{
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  GLfloat local_34;
  GLfloat local_30;
  GLfloat local_2c;
  
  local_34 = sampleShading;
  local_30 = min;
  local_2c = max;
  deqp::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderCase_01decd30;
  this->m_glslVersion = glslVersion;
  this->m_internalFormat = internalFormat;
  this->m_texFormat = *texFormat;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_35);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,&local_36);
  this->m_min = local_30;
  this->m_max = local_2c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_37);
  this->m_sampleShading = local_34;
  return;
}

Assistant:

SampleShadingRenderCase::SampleShadingRenderCase(Context& context, const char* name, const char* description,
												 glu::GLSLVersion glslVersion, GLenum internalFormat,
												 tcu::TextureFormat const& texFormat, const char* sampler,
												 const char* outType, GLfloat min, GLfloat max, const char* extension,
												 GLfloat sampleShading)
	: TestCase(context, name, description)
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
	, m_sampleShading(sampleShading)
{
	DE_ASSERT(glslVersion == glu::GLSL_VERSION_310_ES || glslVersion >= glu::GLSL_VERSION_400);
}